

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O2

void get_sesslist(sesslist *list,_Bool allocate)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  strbuf *out;
  settings_e *handle;
  char *pcVar4;
  char **ppcVar5;
  int iVar6;
  undefined7 in_register_00000031;
  size_t __nmemb;
  
  if ((int)CONCAT71(in_register_00000031,allocate) == 0) {
    safefree(list->buffer);
    safefree(list->sessions);
    list->sessions = (char **)0x0;
    list->buffer = (char *)0x0;
    return;
  }
  out = strbuf_new();
  if (sesslist_demo_mode == true) {
    BinarySink_put_asciz(out->binarysink_,"demo-server");
    BinarySink_put_asciz(out->binarysink_,"demo-server-2");
  }
  else {
    handle = enum_settings_start();
    if (handle != (settings_e *)0x0) {
      while (_Var2 = enum_settings_next(handle,out), _Var2) {
        BinarySink_put_byte(out->binarysink_,'\0');
      }
      enum_settings_finish(handle);
    }
    BinarySink_put_byte(out->binarysink_,'\0');
  }
  pcVar4 = strbuf_to_str(out);
  list->buffer = pcVar4;
  list->nsessions = 1;
  iVar6 = 1;
  while (*pcVar4 != '\0') {
    iVar3 = strcmp(pcVar4,"Default Settings");
    if (iVar3 != 0) {
      iVar6 = iVar6 + 1;
      list->nsessions = iVar6;
    }
    do {
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  ppcVar5 = (char **)safemalloc((long)(iVar6 + 1),8,0);
  list->sessions = ppcVar5;
  *ppcVar5 = "Default Settings";
  pcVar4 = list->buffer;
  iVar6 = 1;
  while (__nmemb = (size_t)iVar6, *pcVar4 != '\0') {
    iVar3 = strcmp(pcVar4,"Default Settings");
    if (iVar3 != 0) {
      iVar6 = iVar6 + 1;
      list->sessions[__nmemb] = pcVar4;
    }
    do {
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  qsort(list->sessions,__nmemb,8,sessioncmp);
  return;
}

Assistant:

void get_sesslist(struct sesslist *list, bool allocate)
{
    int i;
    char *p;
    settings_e *handle;

    if (allocate) {
        strbuf *sb = strbuf_new();

        if (sesslist_demo_mode) {
            put_asciz(sb, "demo-server");
            put_asciz(sb, "demo-server-2");
        } else {
            if ((handle = enum_settings_start()) != NULL) {
                while (enum_settings_next(handle, sb))
                    put_byte(sb, '\0');
                enum_settings_finish(handle);
            }
            put_byte(sb, '\0');
        }

        list->buffer = strbuf_to_str(sb);

        /*
         * Now set up the list of sessions. Note that "Default
         * Settings" must always be claimed to exist, even if it
         * doesn't really.
         */

        p = list->buffer;
        list->nsessions = 1;           /* "Default Settings" counts as one */
        while (*p) {
            if (strcmp(p, "Default Settings"))
                list->nsessions++;
            while (*p)
                p++;
            p++;
        }

        list->sessions = snewn(list->nsessions + 1, const char *);
        list->sessions[0] = "Default Settings";
        p = list->buffer;
        i = 1;
        while (*p) {
            if (strcmp(p, "Default Settings"))
                list->sessions[i++] = p;
            while (*p)
                p++;
            p++;
        }

        qsort(list->sessions, i, sizeof(const char *), sessioncmp);
    } else {
        sfree(list->buffer);
        sfree(list->sessions);
        list->buffer = NULL;
        list->sessions = NULL;
    }
}